

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

void __thiscall
TIFFImageHandler::ComposePDFPageOrient(TIFFImageHandler *this,T2P_BOX *boxp,uint16_t orientation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar4 = boxp->x1;
  fVar5 = boxp->x2;
  fVar1 = fVar5;
  if (fVar5 < fVar4) {
    boxp->x1 = fVar5;
    boxp->x2 = fVar4;
    fVar1 = fVar4;
    fVar4 = fVar5;
  }
  fVar5 = boxp->y1;
  fVar2 = boxp->y2;
  fVar3 = fVar2;
  if (fVar2 < fVar5) {
    boxp->y1 = fVar2;
    boxp->y2 = fVar5;
    fVar3 = fVar5;
    fVar5 = fVar2;
  }
  fVar1 = fVar1 - fVar4;
  fVar3 = fVar3 - fVar5;
  boxp->mat[0] = fVar1;
  boxp->mat[1] = 0.0;
  boxp->mat[2] = 0.0;
  boxp->mat[3] = 0.0;
  boxp->mat[4] = fVar3;
  boxp->mat[5] = 0.0;
  boxp->mat[6] = fVar4;
  boxp->mat[7] = fVar5;
  boxp->mat[8] = 1.0;
  switch(orientation) {
  case 2:
    boxp->mat[0] = 0.0 - fVar1;
    break;
  case 3:
    boxp->mat[0] = 0.0 - fVar1;
    boxp->mat[4] = 0.0 - fVar3;
    fVar2 = fVar1;
    goto LAB_001b666a;
  case 4:
    boxp->mat[4] = 0.0 - fVar3;
    goto LAB_001b6626;
  case 5:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = 0.0 - fVar1;
    boxp->mat[3] = 0.0 - fVar3;
    boxp->mat[4] = 0.0;
    fVar2 = fVar3;
    fVar3 = fVar1;
LAB_001b666a:
    *(ulong *)(boxp->mat + 6) = CONCAT44(fVar5 + fVar3,fVar4 + fVar2);
    return;
  case 6:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = 0.0 - fVar1;
    boxp->mat[3] = fVar3;
    boxp->mat[4] = 0.0;
    fVar3 = fVar1;
LAB_001b6626:
    boxp->mat[7] = fVar5 + fVar3;
    return;
  case 7:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = fVar1;
    boxp->mat[3] = fVar3;
    boxp->mat[4] = 0.0;
    return;
  case 8:
    boxp->mat[0] = 0.0;
    boxp->mat[1] = fVar1;
    boxp->mat[3] = 0.0 - fVar3;
    boxp->mat[4] = 0.0;
    fVar1 = fVar3;
    break;
  default:
    goto switchD_001b65e0_default;
  }
  boxp->mat[6] = fVar4 + fVar1;
switchD_001b65e0_default:
  return;
}

Assistant:

void TIFFImageHandler::ComposePDFPageOrient(T2P_BOX* boxp, uint16_t orientation)
{

	float m1[9];
	float f=0.0;
	
	if( boxp->x1 > boxp->x2)
	{
		f=boxp->x1;
		boxp->x1=boxp->x2;
		boxp->x2 = f;
	}
	if( boxp->y1 > boxp->y2)
	{
		f=boxp->y1;
		boxp->y1=boxp->y2;
		boxp->y2 = f;
	}
	boxp->mat[0]=m1[0]=boxp->x2-boxp->x1;
	boxp->mat[1]=m1[1]=0.0;
	boxp->mat[2]=m1[2]=0.0;
	boxp->mat[3]=m1[3]=0.0;
	boxp->mat[4]=m1[4]=boxp->y2-boxp->y1;
	boxp->mat[5]=m1[5]=0.0;
	boxp->mat[6]=m1[6]=boxp->x1;
	boxp->mat[7]=m1[7]=boxp->y1;
	boxp->mat[8]=m1[8]=1.0;
	switch(orientation)
	{
		case 0:
		case 1:
			break;
		case 2:
			boxp->mat[0]=0.0F-m1[0];
			boxp->mat[6]+=m1[0];
			break;
		case 3:
			boxp->mat[0]=0.0F-m1[0];
			boxp->mat[4]=0.0F-m1[4];
			boxp->mat[6]+=m1[0];
			boxp->mat[7]+=m1[4];
			break;
		case 4:
			boxp->mat[4]=0.0F-m1[4];
			boxp->mat[7]+=m1[4];
			break;
		case 5:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=0.0F-m1[0];
			boxp->mat[3]=0.0F-m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[6]+=m1[4];
			boxp->mat[7]+=m1[0];
			break;
		case 6:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=0.0F-m1[0];
			boxp->mat[3]=m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[7]+=m1[0];
			break;
		case 7:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=m1[0];
			boxp->mat[3]=m1[4];
			boxp->mat[4]=0.0F;
			break;
		case 8:
			boxp->mat[0]=0.0F;
			boxp->mat[1]=m1[0];
			boxp->mat[3]=0.0F-m1[4];
			boxp->mat[4]=0.0F;
			boxp->mat[6]+=m1[4];
			break;
	}
}